

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilesBoard.cpp
# Opt level: O0

void __thiscall TilesBoard::deleteTiles(TilesBoard *this)

{
  long *plVar1;
  QLayoutItem *item;
  TilesBoard *this_local;
  
  std::
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  ::clear(&this->tiles);
  while (plVar1 = (long *)(**(code **)(*(long *)this->verticalLayout + 0xb0))
                                    (this->verticalLayout,0), plVar1 != (long *)0x0) {
    QLayout::removeItem((QLayoutItem *)this->verticalLayout);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::vector<QHBoxLayout_*,_std::allocator<QHBoxLayout_*>_>::clear(&this->horizontalLayouts);
  return;
}

Assistant:

void TilesBoard::deleteTiles()
{
    tiles.clear();

    QLayoutItem* item;
    while (( item = verticalLayout->takeAt( 0 )))
    {
        verticalLayout->removeItem( 0 );
        delete item;
    }
    horizontalLayouts.clear();
}